

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::String(String *this,tagbstring *x)

{
  uchar *puVar1;
  tagbstring *x_local;
  String *this_local;
  
  (this->super_tagbstring).slen = x->slen;
  (this->super_tagbstring).mlen = (this->super_tagbstring).slen + 1;
  (this->super_tagbstring).data = (uchar *)0x0;
  if ((-1 < (this->super_tagbstring).slen) && (x->data != (uchar *)0x0)) {
    puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar1;
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0xb9,"Failure in (tagbstring) constructor");
  }
  else {
    memcpy((this->super_tagbstring).data,x->data,(long)(this->super_tagbstring).slen);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

String::String(const tagbstring& x)
    {
        slen = x.slen;
        mlen = slen + 1;
        data = 0;
        if (slen >= 0 && x.data != NULL)
            data = (uint8 * ) malloc(mlen);
        if (!data)
        {
            bstringThrow("Failure in (tagbstring) constructor");
        }
        else
        {
            memcpy(data, x.data, slen);
            data[slen] = '\0';
        }
    }